

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

string * __thiscall
(anonymous_namespace)::WriteJson_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Value *value)

{
  Value *pVVar1;
  Value *in_RCX;
  StreamWriterBuilder writer;
  allocator<char> local_91;
  String local_90;
  Value local_70;
  StreamWriterBuilder local_48;
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_48);
  Json::Value::Value(&local_70,"  ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"indentation",&local_91);
  pVVar1 = Json::StreamWriterBuilder::operator[](&local_48,&local_90);
  Json::Value::operator=(pVVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_70,"None");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"commentStyle",&local_91);
  pVVar1 = Json::StreamWriterBuilder::operator[](&local_48,&local_90);
  Json::Value::operator=(pVVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  Json::Value::~Value(&local_70);
  Json::writeString_abi_cxx11_(__return_storage_ptr__,(Json *)&local_48,(Factory *)this,in_RCX);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string WriteJson(const Json::Value& value)
{
  Json::StreamWriterBuilder writer;
  writer["indentation"] = "  ";
  writer["commentStyle"] = "None";
  return Json::writeString(writer, value);
}